

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hmac.c
# Opt level: O1

void beltHMACStepG_internal(void *state)

{
  u32 *h;
  void *stack;
  long lVar1;
  
  *(undefined8 *)((long)state + 0xc0) = *(undefined8 *)((long)state + 0x10);
  *(undefined8 *)((long)state + 200) = *(undefined8 *)((long)state + 0x18);
  h = (u32 *)((long)state + 0x40);
  *(undefined8 *)((long)state + 0x40) = *(undefined8 *)((long)state + 0x20);
  *(undefined8 *)((long)state + 0x48) = *(undefined8 *)((long)state + 0x28);
  *(undefined8 *)((long)state + 0x50) = *(undefined8 *)((long)state + 0x30);
  *(undefined8 *)((long)state + 0x58) = *(undefined8 *)((long)state + 0x38);
  lVar1 = *(long *)((long)state + 0xf0);
  if (lVar1 != 0) {
    memSet((void *)((long)state + lVar1 + 0xd0),'\0',0x20 - lVar1);
    beltCompr2((u32 *)((long)state + 0x10),h,(u32 *)((long)state + 0xd0),
               (void *)((long)state + 0xf8));
  }
  stack = (void *)((long)state + 0xf8);
  beltCompr(h,(u32 *)state,stack);
  *(undefined8 *)((long)state + 0x10) = *(undefined8 *)((long)state + 0xc0);
  *(undefined8 *)((long)state + 0x18) = *(undefined8 *)((long)state + 200);
  *(undefined8 *)((long)state + 0xc0) = *(undefined8 *)((long)state + 0x70);
  *(undefined8 *)((long)state + 200) = *(undefined8 *)((long)state + 0x78);
  *(undefined8 *)((long)state + 0xa0) = *(undefined8 *)((long)state + 0x80);
  *(undefined8 *)((long)state + 0xa8) = *(undefined8 *)((long)state + 0x88);
  *(undefined8 *)((long)state + 0xb0) = *(undefined8 *)((long)state + 0x90);
  *(undefined8 *)((long)state + 0xb8) = *(undefined8 *)((long)state + 0x98);
  beltCompr2((u32 *)((long)state + 0x70),(u32 *)((long)state + 0xa0),h,stack);
  beltCompr((u32 *)((long)state + 0xa0),(u32 *)((long)state + 0x60),stack);
  *(undefined8 *)((long)state + 0x70) = *(undefined8 *)((long)state + 0xc0);
  *(undefined8 *)((long)state + 0x78) = *(undefined8 *)((long)state + 200);
  return;
}

Assistant:

static void beltHMACStepG_internal(void* state)
{
	belt_hmac_st* st = (belt_hmac_st*)state;
	// pre
	ASSERT(memIsValid(state, beltHash_keep()));
	// создать копии второй части st->ls_in и st->h_in
	beltBlockCopy(st->s1, st->ls_in + 4);
	beltBlockCopy(st->h1_in, st->h_in);
	beltBlockCopy(st->h1_in + 4, st->h_in + 4);
	// есть необработанные данные?
	if (st->filled)
	{
		memSetZero(st->block + st->filled, 32 - st->filled);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
		beltBlockRevU32(st->block + 16);
#endif
		beltCompr2(st->ls_in + 4, st->h1_in, (u32*)st->block, st->stack);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block + 16);
		beltBlockRevU32(st->block);
#endif
	}
	// последний блок внутреннего хэширования
	beltCompr(st->h1_in, st->ls_in, st->stack);
	// восстановить сохраненную часть st->ls_in
	beltBlockCopy(st->ls_in + 4, st->s1);
	// создать копии второй части st->ls_out и st->h_out
	beltBlockCopy(st->s1, st->ls_out + 4);
	beltBlockCopy(st->h1_out, st->h_out);
	beltBlockCopy(st->h1_out + 4, st->h_out + 4);
	// обработать блок st->h1_in
	beltCompr2(st->ls_out + 4, st->h1_out, st->h1_in, st->stack);
	// последний блок внешнего хэширования
	beltCompr(st->h1_out, st->ls_out, st->stack);
	// восстановить сохраненную часть st->ls_out
	beltBlockCopy(st->ls_out + 4, st->s1);
}